

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZEllipse3D::GradX<Fad<double>>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *fadexpr;
  TPZVec<Fad<double>_> *in_RDX;
  Fad<double> *in_RDI;
  Fad<double> *w;
  int i_1;
  int j;
  int i;
  TPZFMatrix<Fad<double>_> axloc;
  int transp;
  TPZFNMatrix<3,_Fad<double>_> dxcoglob;
  TPZFNMatrix<3,_Fad<double>_> dxcoloc;
  Fad<double> angle;
  Fad<double> dangledqsi;
  REAL delangle;
  Fad<double> *in_stack_fffffffffffffac0;
  double *in_stack_fffffffffffffac8;
  Fad<double> *in_stack_fffffffffffffad0;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  *in_stack_fffffffffffffad8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffae0;
  TPZFMatrix<Fad<double>_> *this_00;
  FadExpr<FadFuncSin<Fad<double>_>_> *e;
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>
  *in_stack_fffffffffffffb08;
  Fad<double> *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  int iVar1;
  int64_t in_stack_fffffffffffffb30;
  Fad<double> *in_stack_fffffffffffffb38;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffb40;
  int64_t in_stack_fffffffffffffb48;
  TPZFNMatrix<3,_Fad<double>_> *in_stack_fffffffffffffb50;
  int local_488;
  int local_484;
  Fad<double> *in_stack_fffffffffffffce8;
  Fad<double> *in_stack_fffffffffffffcf0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffcf8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffd00;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffd08;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd20;
  
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  e = (FadExpr<FadFuncSin<Fad<double>_>_> *)in_RDI[10].val_;
  TPZVec<Fad<double>_>::operator[](in_RDX,0);
  operator+<Fad<double>,_double,_nullptr>
            ((Fad<double> *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             (double)in_stack_fffffffffffffb10);
  operator/<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             (double)in_stack_fffffffffffffb10);
  operator*<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
              *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             (double)in_stack_fffffffffffffb10);
  operator+<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffffb08,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
              *)e);
  Fad<double>::
  Fad<FadBinaryAdd<FadCst<double>,FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>,FadCst<double>>>,FadCst<double>>>>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffffac0);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffac0);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffac0);
  FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffac0);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,(int64_t)in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb38);
  Fad<double>::~Fad(in_stack_fffffffffffffac0);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,(int64_t)in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb38);
  Fad<double>::~Fad(in_stack_fffffffffffffac0);
  w = (Fad<double> *)((ulong)in_RDI->defaultVal ^ 0x8000000000000000);
  sin<double>(in_RDI);
  operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffffb08,e);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffae0,(int64_t)in_stack_fffffffffffffad8,
             (int64_t)in_stack_fffffffffffffad0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
             in_stack_fffffffffffffac0);
  FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffffac0);
  this_00 = (TPZFMatrix<Fad<double>_> *)in_RDI[1].val_;
  cos<double>(in_RDI);
  operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffffb08,(FadExpr<FadFuncCos<Fad<double>_>_> *)e);
  fadexpr = TPZFMatrix<Fad<double>_>::operator()
                      (this_00,(int64_t)in_stack_fffffffffffffad8,(int64_t)in_stack_fffffffffffffad0
                      );
  Fad<double>::operator=
            ((Fad<double> *)this_00,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)fadexpr)
  ;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
             in_stack_fffffffffffffac0);
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffac0);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30)
  ;
  for (local_484 = 0; local_484 < 3; local_484 = local_484 + 1) {
    for (local_488 = 0; local_488 < 3; local_488 = local_488 + 1) {
      TPZFMatrix<double>::GetVal
                ((TPZFMatrix<double> *)&in_RDI[1].dx_,(long)local_484,(long)local_488);
      in_stack_fffffffffffffad0 =
           TPZFMatrix<Fad<double>_>::operator()
                     (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffffad0);
      Fad<double>::operator=<double,_nullptr>(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    }
  }
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  TPZFMatrix<Fad<double>_>::MultAdd
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             in_stack_fffffffffffffd20);
  Fad<double>::~Fad(in_stack_fffffffffffffac0);
  Fad<double>::~Fad(in_stack_fffffffffffffac0);
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    TPZFMatrix<Fad<double>_>::operator()
              (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffffad0);
    operator*<Fad<double>,_Fad<double>,_nullptr>(in_RDI,w);
    in_stack_fffffffffffffac0 =
         TPZFMatrix<Fad<double>_>::operator()
                   (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffffad0);
    Fad<double>::operator=
              ((Fad<double> *)this_00,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)fadexpr);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffac0);
  }
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x173f825);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x173f832);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x173f83f);
  Fad<double>::~Fad(in_stack_fffffffffffffac0);
  Fad<double>::~Fad(in_stack_fffffffffffffac0);
  return;
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}